

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_tuple_primitive_nextInstanceWithSameType
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  long *tuple;
  _Bool _Var1;
  bool bVar2;
  undefined8 *local_58;
  sysbvm_heap_mallocObjectHeader_t *nextObject;
  sysbvm_heap_mallocObjectHeader_t *objectPreheader;
  sysbvm_tuple_t expectedType;
  sysbvm_tuple_header_t *objectHeader;
  sysbvm_tuple_t object;
  sysbvm_tuple_t *arguments_local;
  size_t argumentCount_local;
  sysbvm_tuple_t closure_local;
  sysbvm_context_t *context_local;
  
  if (argumentCount != 1) {
    sysbvm_error_argumentCountMismatch(1,argumentCount);
  }
  tuple = (long *)*arguments;
  _Var1 = sysbvm_tuple_isNonNullPointer((sysbvm_tuple_t)tuple);
  if (_Var1) {
    local_58 = (undefined8 *)tuple[-2];
    while( true ) {
      bVar2 = false;
      if (local_58 != (undefined8 *)0x0) {
        bVar2 = local_58[2] != *tuple;
      }
      if (!bVar2) break;
      local_58 = (undefined8 *)*local_58;
    }
    if (local_58 == (undefined8 *)0x0) {
      context_local = (sysbvm_context_t *)0x0;
    }
    else {
      context_local = (sysbvm_context_t *)(local_58 + 2);
    }
  }
  else {
    context_local = (sysbvm_context_t *)0x0;
  }
  return (sysbvm_tuple_t)context_local;
}

Assistant:

static sysbvm_tuple_t sysbvm_tuple_primitive_nextInstanceWithSameType(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 1) sysbvm_error_argumentCountMismatch(1, argumentCount);

    sysbvm_tuple_t object = arguments[0];
    if(!sysbvm_tuple_isNonNullPointer(object))
        return SYSBVM_NULL_TUPLE;

    sysbvm_tuple_header_t *objectHeader = (sysbvm_tuple_header_t*)object;
    sysbvm_tuple_t expectedType = objectHeader->typePointer;

    sysbvm_heap_mallocObjectHeader_t *objectPreheader = (sysbvm_heap_mallocObjectHeader_t*)object - 1;
    sysbvm_heap_mallocObjectHeader_t *nextObject = objectPreheader->next;
    while(nextObject && ((sysbvm_tuple_header_t *)(nextObject + 1))->typePointer != expectedType)
        nextObject = nextObject->next;
    
    if(!nextObject)
        return SYSBVM_NULL_TUPLE;

    return (sysbvm_tuple_t)(nextObject + 1);
}